

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

word Gia_ManAutomSim0(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wrd_t *vTemp)

{
  int iVar1;
  word wVar2;
  undefined8 local_28;
  Vec_Wrd_t *vTemp_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjFaninC0(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    local_28 = Vec_WrdEntry(vTemp,iVar1);
  }
  else {
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    wVar2 = Vec_WrdEntry(vTemp,iVar1);
    local_28 = wVar2 ^ 0xffffffffffffffff;
  }
  return local_28;
}

Assistant:

static inline word Gia_ManAutomSim0( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wrd_t * vTemp )
{
    return Gia_ObjFaninC0(pObj) ? ~Vec_WrdEntry(vTemp, Gia_ObjFaninId0p(p, pObj)) : Vec_WrdEntry(vTemp, Gia_ObjFaninId0p(p, pObj));
}